

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::anon_unknown_3::SymbolProperties::SetFunction(SymbolProperties *this,char *function)

{
  void *__ptr;
  char *__s;
  int status;
  string result;
  int local_3c;
  string local_38 [32];
  
  __s = "???";
  if (function != (char *)0x0) {
    __s = function;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,(allocator<char> *)&local_3c);
  local_3c = 0;
  __ptr = (void *)__cxa_demangle(function,0,0,&local_3c);
  if (local_3c == 0) {
    std::__cxx11::string::assign((char *)local_38);
  }
  free(__ptr);
  std::__cxx11::string::operator=((string *)&this->Function,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SetFunction(const char* function)
  {
    this->Function = this->Demangle(function);
  }